

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O1

int SimpleString::AtoI(char *str)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  
  for (; (bVar1 = *str, bVar1 - 9 < 5 || (bVar1 == 0x20)); str = (char *)((byte *)str + 1)) {
  }
  if ((bVar1 == 0x2b) || (bVar1 == 0x2d)) {
    str = (char *)((byte *)str + 1);
  }
  bVar2 = *str;
  iVar4 = 0;
  if ((byte)(bVar2 - 0x30) < 10) {
    iVar4 = 0;
    do {
      str = (char *)((byte *)str + 1);
      iVar4 = (uint)bVar2 + iVar4 * 10 + -0x30;
      bVar2 = *str;
    } while ((byte)(bVar2 - 0x30) < 10);
  }
  iVar3 = -iVar4;
  if (bVar1 != 0x2d) {
    iVar3 = iVar4;
  }
  return iVar3;
}

Assistant:

int SimpleString::AtoI(const char* str)
{
    while (isSpace(*str)) str++;

    char first_char = *str;
    if (first_char == '-' || first_char == '+') str++;

    int  result = 0;
    for(; isDigit(*str); str++)
    {
        result *= 10;
        result += *str - '0';
    }
    return (first_char == '-') ? -result : result;
}